

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O1

mz_bool mz_zip_writer_add_mem_ex
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32)

{
  char cVar1;
  mz_uint mVar2;
  mz_zip_internal_state *pArray;
  undefined4 uVar3;
  mz_uint16 method;
  mz_uint16 mVar4;
  tdefl_compressor *d;
  size_t sVar5;
  mz_bool mVar6;
  tdefl_status tVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  mz_uint64 mVar14;
  uint uVar15;
  mz_uint16 dos_time_00;
  mz_uint16 dos_date_00;
  mz_uint64 in_stack_ffffffffffffff18;
  mz_uint32 in_stack_ffffffffffffff20;
  byte local_d9;
  ulong local_d8;
  ulong local_d0;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  tdefl_compressor *local_c0;
  size_t local_b8;
  char *local_b0;
  mz_ulong local_a8;
  mz_uint8 *local_a0;
  void *local_98;
  mz_uint64 local_90;
  mz_uint8 local_dir_header [30];
  mz_zip_writer_add_state state;
  
  dos_time = 0;
  dos_date = 0;
  uVar15 = 6;
  if (-1 < (int)level_and_flags) {
    uVar15 = level_and_flags;
  }
  uVar12 = uVar15 & 0xf;
  pArray = pZip->m_pState;
  if (pArray == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if (pArchive_name == (char *)0x0) {
    return 0;
  }
  if (pBuf == (void *)0x0 && buf_size != 0) {
    return 0;
  }
  if (pComment == (void *)0x0 && comment_size != 0) {
    return 0;
  }
  if (10 < uVar12) {
    return 0;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  uVar15 = uVar15 & 0x400;
  local_98 = (void *)uncomp_size;
  if ((uncomp_size | buf_size) >> 0x20 != 0) {
    return 0;
  }
  if (uncomp_size != 0 && uVar15 == 0) {
    return 0;
  }
  if (*pArchive_name == '/') {
    return 0;
  }
  local_a8 = (mz_ulong)uncomp_crc32;
  mVar14 = pZip->m_archive_size;
  local_d9 = uVar12 == 0 | (byte)(uVar15 >> 10);
  for (pcVar8 = pArchive_name; cVar1 = *pcVar8, cVar1 != '\0'; pcVar8 = pcVar8 + 1) {
    if (cVar1 == ':') {
      return 0;
    }
    if (cVar1 == '\\') {
      return 0;
    }
  }
  local_b0 = pArchive_name;
  local_a0 = (mz_uint8 *)pBuf;
  time((time_t *)local_dir_header);
  mz_zip_time_to_dos_time(local_dir_header._0_8_,&dos_time,&dos_date);
  local_b8 = strlen(local_b0);
  if (0xffff < local_b8) {
    return 0;
  }
  mVar2 = pZip->m_file_offset_alignment;
  if (mVar2 == 0) {
    uVar13 = 0;
  }
  else {
    uVar13 = mVar2 - ((uint)pZip->m_archive_size & mVar2 - 1) & mVar2 - 1;
  }
  uVar10 = (ulong)uVar13;
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  if (pZip->m_archive_size + comment_size + local_b8 + uVar10 + 0x4c >> 0x20 != 0) {
    return 0;
  }
  dos_time_00 = 0;
  if ((local_b8 != 0) && (local_b0[local_b8 - 1] == '/')) {
    if ((uncomp_size | buf_size) != 0) {
      return 0;
    }
    dos_time_00 = 0x10;
  }
  uVar11 = (pArray->m_central_dir).m_size + comment_size + local_b8 + 0x2e;
  if ((((pArray->m_central_dir).m_capacity < uVar11) &&
      (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar11,1), mVar6 == 0)) ||
     ((uVar11 = (pArray->m_central_dir_offsets).m_size + 1,
      (pArray->m_central_dir_offsets).m_capacity < uVar11 &&
      (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar11,1),
      mVar6 == 0)))) {
    return 0;
  }
  if (buf_size == 0 || local_d9 != 0) {
    local_c0 = (tdefl_compressor *)0x0;
  }
  else {
    local_c0 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (local_c0 == (tdefl_compressor *)0x0) {
      return 0;
    }
  }
  mVar6 = mz_zip_writer_write_zeros(pZip,mVar14,(mz_uint32)(uVar10 + 0x1e));
  sVar5 = local_b8;
  if (mVar6 != 0) {
    local_90 = uVar10 + mVar14;
    if ((pZip->m_file_offset_alignment != 0) &&
       (((uint)local_90 & pZip->m_file_offset_alignment - 1) != 0)) {
      __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/assetsys.h"
                    ,0x1290,
                    "mz_bool mz_zip_writer_add_mem_ex(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32)"
                   );
    }
    mVar14 = uVar10 + 0x1e + mVar14;
    local_dir_header[0x10] = '\0';
    local_dir_header[0x11] = '\0';
    local_dir_header[0x12] = '\0';
    local_dir_header[0x13] = '\0';
    local_dir_header[0x14] = '\0';
    local_dir_header[0x15] = '\0';
    local_dir_header[0x16] = '\0';
    local_dir_header[0x17] = '\0';
    local_dir_header[0x18] = '\0';
    local_dir_header[0x19] = '\0';
    local_dir_header[0x1a] = '\0';
    local_dir_header[0x1b] = '\0';
    local_dir_header[0x1c] = '\0';
    local_dir_header[0x1d] = '\0';
    local_dir_header[0] = '\0';
    local_dir_header[1] = '\0';
    local_dir_header[2] = '\0';
    local_dir_header[3] = '\0';
    local_dir_header[4] = '\0';
    local_dir_header[5] = '\0';
    local_dir_header[6] = '\0';
    local_dir_header[7] = '\0';
    local_dir_header[8] = '\0';
    local_dir_header[9] = '\0';
    local_dir_header[10] = '\0';
    local_dir_header[0xb] = '\0';
    local_dir_header[0xc] = '\0';
    local_dir_header[0xd] = '\0';
    local_dir_header[0xe] = '\0';
    local_dir_header[0xf] = '\0';
    sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar14,local_b0,local_b8);
    if (sVar9 == sVar5) {
      if (uVar15 == 0) {
        local_a8 = mz_crc32(0,local_a0,buf_size);
        if (buf_size < 4) {
          uVar12 = 0;
        }
        local_d9 = local_d9 | buf_size < 4;
        local_98 = (void *)buf_size;
      }
      d = local_c0;
      local_d8 = mVar14 + local_b8;
      if (local_d9 == 0) {
        if (buf_size == 0) {
          mVar14 = 0;
          local_d0 = 0;
        }
        else {
          state.m_comp_size = 0;
          uVar10 = 10;
          if (uVar12 < 10) {
            uVar10 = (ulong)uVar12;
          }
          uVar13 = (uint)(uVar12 < 4) << 0xe |
                   tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar10];
          uVar15 = uVar13 | 0x80000;
          if (uVar12 != 0) {
            uVar15 = uVar13;
          }
          state.m_pZip = pZip;
          state.m_cur_archive_file_ofs = local_d8;
          tdefl_init(local_c0,mz_zip_writer_add_put_buf_callback,&state,uVar15);
          tVar7 = tdefl_compress_buffer(d,local_a0,buf_size,TDEFL_FINISH);
          if (tVar7 != TDEFL_STATUS_DONE) {
            (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_c0);
            return 0;
          }
          local_d8 = state.m_cur_archive_file_ofs;
          local_d0 = state.m_comp_size;
          mVar14 = 8;
        }
      }
      else {
        sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_d8,local_a0,buf_size);
        if (sVar9 != buf_size) goto LAB_0014e3f9;
        local_d8 = local_d8 + buf_size;
        mVar14 = (mz_uint64)(uVar15 >> 7);
        local_d0 = buf_size;
      }
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_c0);
      mVar4 = dos_time;
      method = dos_date;
      if (local_d0 >> 0x20 != 0) {
        return 0;
      }
      if (local_d8 >> 0x20 == 0) {
        local_dir_header[4] = '\x14';
        if ((short)mVar14 == 0) {
          local_dir_header[4] = '\0';
        }
        builtin_memcpy(local_dir_header,"PK\x03\x04",4);
        local_dir_header[5] = '\0';
        local_dir_header[6] = '\0';
        local_dir_header[7] = '\0';
        local_dir_header[8] = (mz_uint8)mVar14;
        local_dir_header[9] = '\0';
        local_dir_header[10] = (mz_uint8)dos_time;
        local_dir_header[0xb] = (mz_uint8)(dos_time >> 8);
        local_dir_header[0xc] = (mz_uint8)dos_date;
        local_dir_header[0xd] = (mz_uint8)(dos_date >> 8);
        local_dir_header[0xe] = (mz_uint8)local_a8;
        local_dir_header[0xf] = (mz_uint8)(local_a8 >> 8);
        local_dir_header[0x10] = (mz_uint8)(local_a8 >> 0x10);
        local_dir_header[0x11] = (mz_uint8)(local_a8 >> 0x18);
        local_dir_header[0x12] = (mz_uint8)local_d0;
        local_dir_header[0x13] = (mz_uint8)(local_d0 >> 8);
        local_dir_header[0x14] = (mz_uint8)(local_d0 >> 0x10);
        local_dir_header[0x15] = (mz_uint8)(local_d0 >> 0x18);
        uVar3 = SUB84(local_98,0);
        local_dir_header[0x1a] = (char)local_b8;
        local_dir_header[0x16] = (char)uVar3;
        local_dir_header[0x17] = (char)((uint)uVar3 >> 8);
        local_dir_header[0x18] = (char)((uint)uVar3 >> 0x10);
        local_dir_header[0x19] = (char)((uint)uVar3 >> 0x18);
        local_dir_header[0x1b] = (char)(local_b8 >> 8);
        local_dir_header[0x1c] = '\0';
        local_dir_header[0x1d] = '\0';
        dos_date_00 = 0xe5e2;
        sVar9 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_90,local_dir_header,0x1e);
        if (sVar9 == 0x1e) {
          mVar6 = mz_zip_writer_add_to_central_dir
                            (pZip,local_b0,(mz_uint16)local_b8,pComment,comment_size,local_98,
                             (mz_uint16)local_d0,local_a8,mVar14,(uint)mVar4,method,
                             (mz_uint16)local_90,dos_time_00,dos_date_00,in_stack_ffffffffffffff18,
                             in_stack_ffffffffffffff20);
          if (mVar6 != 0) {
            pZip->m_total_files = pZip->m_total_files + 1;
            pZip->m_archive_size = local_d8;
            return 1;
          }
          return 0;
        }
        return 0;
      }
      return 0;
    }
  }
LAB_0014e3f9:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_c0);
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex(mz_zip_archive *pZip, const char *pArchive_name, const void *pBuf, size_t buf_size, const void *pComment, mz_uint16 comment_size, mz_uint level_and_flags, mz_uint64 uncomp_size, mz_uint32 uncomp_crc32)
{
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  mz_uint level, ext_attributes = 0, num_alignment_padding_bytes;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  tdefl_compressor *pComp = NULL;
  mz_bool store_data_uncompressed;
  mz_zip_internal_state *pState;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;
  store_data_uncompressed = ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) || (!pArchive_name) || ((comment_size) && (!pComment)) || (pZip->m_total_files == 0xFFFF) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;

  pState = pZip->m_pState;

  if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
    return MZ_FALSE;
  // No zip64 support yet
  if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

#ifndef MINIZ_NO_TIME
  {
    time_t cur_time; time(&cur_time);
    mz_zip_time_to_dos_time(cur_time, &dos_time, &dos_date);
  }
#endif // #ifndef MINIZ_NO_TIME

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) || ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/'))
  {
    // Set DOS Subdirectory attribute bit.
    ext_attributes |= 0x10;
    // Subdirectories cannot contain data.
    if ((buf_size) || (uncomp_size))
      return MZ_FALSE;
  }

  // Try to do any allocations before writing to the archive, so if an allocation fails the file remains unmodified. (A good idea if we're doing an in-place modification.)
  if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + archive_name_size + comment_size)) || (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
    return MZ_FALSE;

  if ((!store_data_uncompressed) && (buf_size))
  {
    if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
      return MZ_FALSE;
  }

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes + sizeof(local_dir_header)))
  {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) { MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0); }
  cur_archive_file_ofs += num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size)
  {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
  {
    uncomp_crc32 = (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8*)pBuf, buf_size);
    uncomp_size = buf_size;
    if (uncomp_size <= 3)
    {
      level = 0;
      store_data_uncompressed = MZ_TRUE;
    }
  }

  if (store_data_uncompressed)
  {
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf, buf_size) != buf_size)
    {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    cur_archive_file_ofs += buf_size;
    comp_size = buf_size;

    if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
      method = MZ_DEFLATED;
  }
  else if (buf_size)
  {
    mz_zip_writer_add_state state;

    state.m_pZip = pZip;
    state.m_cur_archive_file_ofs = cur_archive_file_ofs;
    state.m_comp_size = 0;

    if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY) ||
        (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) != TDEFL_STATUS_DONE))
    {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    comp_size = state.m_comp_size;
    cur_archive_file_ofs = state.m_cur_archive_file_ofs;

    method = MZ_DEFLATED;
  }

  pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
  pComp = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size, comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment, comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0, dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}